

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::IncludeScope::EnforceCMP0011(IncludeScope *this)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  PolicyID id;
  PolicyID id_00;
  ostringstream e;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [376];
  
  PVar2 = cmStateSnapshot::GetPolicy(&this->Makefile->StateSnapshot,CMP0011,false);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1c8,(cmPolicies *)0xb,id);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_188,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"The included script\n  ",0x16);
    GetExecutionFilePath_abi_cxx11_(&local_1a8,this->Makefile);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"affects policy settings, so it requires this policy to be set.",0x3e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
  }
  else {
    if (PVar2 != WARN) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0xb,id_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_188,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"The included script\n  ",0x16);
    GetExecutionFilePath_abi_cxx11_(&local_1a8,this->Makefile);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"affects policy settings.  ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"CMake is implying the NO_POLICY_SCOPE option for compatibility, ",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"so the effects are applied to the including context.",0x34);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    IssueMessage(pcVar1,AUTHOR_WARNING,&local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return;
}

Assistant:

void cmMakefile::IncludeScope::EnforceCMP0011()
{
  // We check the setting of this policy again because the included
  // script might actually set this policy for its includer.
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011)) {
    case cmPolicies::WARN:
      // Warn because the user did not set this policy.
      {
        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0011) << "\n"
          << "The included script\n  "
          << this->Makefile->GetExecutionFilePath() << "\n"
          << "affects policy settings.  "
          << "CMake is implying the NO_POLICY_SCOPE option for compatibility, "
          << "so the effects are applied to the including context.";
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0011) << "\n"
        << "The included script\n  "
        << this->Makefile->GetExecutionFilePath() << "\n"
        << "affects policy settings, so it requires this policy to be set.";
      /* clang-format on */
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    } break;
    case cmPolicies::OLD:
    case cmPolicies::NEW:
      // The script set this policy.  We assume the purpose of the
      // script is to initialize policies for its includer, and since
      // the policy is now set for later scripts, we do not warn.
      break;
  }
}